

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strbuf.h
# Opt level: O3

void strbuf_append_mem(strbuf_t *s,char *c,int len)

{
  uint uVar1;
  
  uVar1 = s->length;
  if ((int)(~uVar1 + s->size) < len) {
    strbuf_resize(s,uVar1 + len);
    uVar1 = s->length;
  }
  memcpy(s->buf + (int)uVar1,c,(ulong)(uint)len);
  s->length = s->length + len;
  return;
}

Assistant:

static inline void strbuf_append_mem(strbuf_t *s, const char *c, int len)
{
    strbuf_ensure_empty_length(s, len);
    memcpy(s->buf + s->length, c, len);
    s->length += len;
}